

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool google::protobuf::anon_unknown_31::IsSubSymbol(StringPiece sub_symbol,StringPiece super_symbol)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  StringPiece local_30;
  
  local_30.length_ = super_symbol.length_;
  local_30.ptr_ = super_symbol.ptr_;
  bVar1 = stringpiece_internal::operator==(sub_symbol,super_symbol);
  bVar3 = true;
  if (!bVar1) {
    bVar1 = HasPrefixString(super_symbol,sub_symbol);
    if (bVar1) {
      cVar2 = stringpiece_internal::StringPiece::operator[](&local_30,sub_symbol.length_);
      bVar3 = cVar2 == '.';
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool IsSubSymbol(StringPiece sub_symbol, StringPiece super_symbol) {
  return sub_symbol == super_symbol ||
         (HasPrefixString(super_symbol, sub_symbol) &&
          super_symbol[sub_symbol.size()] == '.');
}